

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_351f5::ArenaTest_FuzzFuseFreeAllocatorRace_Test::TestBody
          (ArenaTest_FuzzFuseFreeAllocatorRace_Test *this)

{
  upb_Arena *a;
  pointer ptVar1;
  pointer ptVar2;
  uint uVar3;
  upb_Arena *puVar4;
  ulong uVar5;
  allocator_type *paVar6;
  allocator_type *paVar7;
  char *pcVar8;
  char *pcVar9;
  anon_class_24_3_d913d062_for__M_head_impl *extraout_RDX;
  anon_class_24_3_d913d062_for__M_head_impl *extraout_RDX_00;
  anon_class_24_3_d913d062_for__M_head_impl *extraout_RDX_01;
  anon_class_24_3_d913d062_for__M_head_impl *extraout_RDX_02;
  anon_class_24_3_d913d062_for__M_head_impl *extraout_RDX_03;
  anon_class_24_3_d913d062_for__M_head_impl *extraout_RDX_04;
  anon_class_24_3_d913d062_for__M_head_impl *__args;
  size_t i;
  long lVar10;
  ulong uVar11;
  allocator_type *paVar12;
  ulong uVar13;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  array<upb_Arena_*,_11UL> *paVar14;
  array<upb_Arena_*,_11UL> *paVar15;
  size_t j;
  long lVar16;
  HiRep HVar17;
  byte bVar18;
  Time TVar19;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  vector<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_> arenas;
  Notification done;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_upb_mem_arena_test_cc:512:40)>
  reset_max_block_size;
  array<upb_Arena_*,_11UL> arr;
  vector<std::thread,_std::allocator<std::thread>_> local_f8;
  upb_Arena local_d8;
  array<upb_Arena_*,_11UL> *local_c8;
  uint local_b4;
  HiRep local_b0;
  Notification local_a8;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_upb_mem_arena_test_cc:512:40)>
  local_98;
  array<upb_Arena_*,_11UL> local_88;
  
  bVar18 = 0;
  upb_Arena_SetMaxBlockSize(0x80);
  local_98.storage_.callback_buffer_ = (char  [8])upb_alloc_global;
  upb_alloc_global.func = checking_global_allocfunc;
  local_98.storage_.is_callback_engaged_ = true;
  lVar10 = 0;
  local_a8.mutex_.mu_.super___atomic_base<long>._M_i = (atomic<long>)(__atomic_base<long>)0x0;
  local_a8.notified_yet_._M_base._M_i = (__atomic_base<bool>)false;
  local_f8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8 = (array<upb_Arena_*,_11UL> *)0x0;
  local_d8.ptr_dont_copy_me__upb_internal_use_only = (char *)0x0;
  local_d8.end_dont_copy_me__upb_internal_use_only = (char *)0x0;
  do {
    local_88._M_elems[0] = upb_Arena_Init((void *)0x0,0,&upb_alloc_global);
    lVar16 = 1;
    do {
      puVar4 = upb_Arena_Init((void *)0x0,0,&upb_alloc_global);
      local_88._M_elems[lVar16] = puVar4;
      upb_Arena_Fuse(*(upb_Arena **)(local_98.storage_.callback_buffer_ + lVar16 * 8),puVar4);
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0xb);
    if ((array<upb_Arena_*,_11UL> *)local_d8.end_dont_copy_me__upb_internal_use_only == local_c8) {
      std::vector<std::array<upb_Arena*,11ul>,std::allocator<std::array<upb_Arena*,11ul>>>::
      _M_realloc_insert<std::array<upb_Arena*,11ul>const&>
                ((vector<std::array<upb_Arena*,11ul>,std::allocator<std::array<upb_Arena*,11ul>>> *)
                 &local_d8,(iterator)local_d8.end_dont_copy_me__upb_internal_use_only,&local_88);
      __args = extraout_RDX_00;
    }
    else {
      paVar14 = &local_88;
      paVar15 = (array<upb_Arena_*,_11UL> *)local_d8.end_dont_copy_me__upb_internal_use_only;
      for (lVar16 = 0xb; lVar16 != 0; lVar16 = lVar16 + -1) {
        paVar15->_M_elems[0] = paVar14->_M_elems[0];
        paVar14 = (array<upb_Arena_*,_11UL> *)((long)paVar14 + ((ulong)bVar18 * -2 + 1) * 8);
        paVar15 = (array<upb_Arena_*,_11UL> *)((long)paVar15 + ((ulong)bVar18 * -2 + 1) * 8);
      }
      local_d8.end_dont_copy_me__upb_internal_use_only =
           (char *)((long)local_d8.end_dont_copy_me__upb_internal_use_only + 0x58);
      __args = extraout_RDX;
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 10000);
  local_b0.lo_ = 0xfffffff8;
  local_b0.hi_ = 0x7fffffff;
  HVar17.lo_ = 0;
  HVar17.hi_ = 0;
  do {
    ptVar2 = local_f8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    ptVar1 = local_f8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_88._M_elems[1] = (upb_Arena *)&local_a8;
    local_88._M_elems[2] = &local_d8;
    local_88._M_elems[0] = (upb_Arena *)HVar17;
    if (local_f8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_f8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      if ((long)local_f8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_f8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar11 = (long)local_f8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_f8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      uVar5 = uVar11 + (uVar11 == 0);
      uVar13 = uVar5 + uVar11;
      if (0xffffffffffffffe < uVar13) {
        uVar13 = 0xfffffffffffffff;
      }
      if (CARRY8(uVar5,uVar11)) {
        uVar13 = 0xfffffffffffffff;
      }
      if (uVar13 == 0) {
        paVar6 = (allocator_type *)0x0;
      }
      else {
        paVar6 = (allocator_type *)
                 __gnu_cxx::new_allocator<std::thread>::allocate
                           ((new_allocator<std::thread> *)&local_f8,uVar13,(void *)0x0);
        __args = extraout_RDX_02;
      }
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,(anonymous_namespace)::ArenaTest_FuzzFuseFreeAllocatorRace_Test::TestBody()::__1>
                (paVar6 + uVar11 * 8,(thread *)&local_88,__args);
      paVar12 = paVar6;
      for (paVar7 = (allocator_type *)ptVar1; paVar7 != (allocator_type *)ptVar2;
          paVar7 = paVar7 + 8) {
        *(native_handle_type *)paVar12 = (native_handle_type)*(id *)paVar7;
        *(id *)paVar7 = (id)0x0;
        paVar12 = paVar12 + 8;
      }
      __args = extraout_RDX_03;
      if ((allocator_type *)ptVar1 != (allocator_type *)0x0) {
        operator_delete(ptVar1,(long)local_f8.
                                     super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)ptVar1);
        __args = extraout_RDX_04;
      }
      local_f8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)(paVar6 + uVar13 * 8);
      local_f8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)paVar6;
    }
    else {
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,(anonymous_namespace)::ArenaTest_FuzzFuseFreeAllocatorRace_Test::TestBody()::__1>
                ((allocator_type *)
                 local_f8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish,(thread *)&local_88,__args);
      __args = extraout_RDX_01;
      paVar12 = (allocator_type *)
                local_f8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    local_f8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)(paVar12 + 8);
    HVar17 = (HiRep)((long)HVar17 + 1);
  } while (HVar17 != (HiRep)0xa);
  TVar19 = absl::lts_20250127::Now();
  local_88._M_elems[0] = (upb_Arena *)TVar19.rep_.rep_hi_;
  local_88._M_elems[1]._0_4_ = TVar19.rep_.rep_lo_;
  absl::lts_20250127::Duration::operator+=((Duration *)&local_88,(Duration)ZEXT812(2));
  uVar3 = (uint)local_88._M_elems[1];
  puVar4 = local_88._M_elems[0];
  local_b4 = (uint)local_88._M_elems[1] + 1;
  local_b0 = (HiRep)((long)local_b0 + 8);
  lVar10 = 0x50;
  uVar13 = 0xffffffffffffffff;
  do {
    TVar19 = absl::lts_20250127::Now();
    if (TVar19.rep_.rep_hi_ == (HiRep)puVar4) {
      if ((HiRep)puVar4 == local_b0) {
        if (local_b4 <= TVar19.rep_.rep_lo_ + 1) goto LAB_001782de;
      }
      else if (uVar3 <= TVar19.rep_.rep_lo_) goto LAB_001782de;
    }
    else if ((long)puVar4 <= (long)TVar19.rep_.rep_hi_) goto LAB_001782de;
    if ((ulong)(((long)local_d8.end_dont_copy_me__upb_internal_use_only -
                 (long)local_d8.ptr_dont_copy_me__upb_internal_use_only >> 3) * 0x2e8ba2e8ba2e8ba3)
        <= uVar13 + 1) {
LAB_001782de:
      absl::lts_20250127::Notification::Notify(&local_a8);
      while (ptVar1 = local_f8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                      .super__Vector_impl_data._M_finish, uVar13 = uVar13 + 1,
            paVar6 = (allocator_type *)
                     local_f8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                     super__Vector_impl_data._M_start,
            uVar13 < (ulong)(((long)local_d8.end_dont_copy_me__upb_internal_use_only -
                              (long)local_d8.ptr_dont_copy_me__upb_internal_use_only >> 3) *
                            0x2e8ba2e8ba2e8ba3)) {
        pcVar9 = local_d8.ptr_dont_copy_me__upb_internal_use_only + lVar10;
        lVar10 = lVar10 + 0x58;
        upb_Arena_Free(*(upb_Arena **)pcVar9);
      }
      for (; paVar6 != (allocator_type *)ptVar1; paVar6 = paVar6 + 8) {
        std::thread::join();
      }
      if (local_d8.ptr_dont_copy_me__upb_internal_use_only != (char *)0x0) {
        operator_delete(local_d8.ptr_dont_copy_me__upb_internal_use_only,
                        (long)local_c8 - (long)local_d8.ptr_dont_copy_me__upb_internal_use_only);
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_f8);
      absl::lts_20250127::Notification::~Notification(&local_a8);
      absl::lts_20250127::
      Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena_test.cc:512:40)>
      ::~Cleanup(&local_98);
      return;
    }
    a = *(upb_Arena **)(local_d8.ptr_dont_copy_me__upb_internal_use_only + lVar10);
    pcVar8 = a->ptr_dont_copy_me__upb_internal_use_only;
    pcVar9 = a->end_dont_copy_me__upb_internal_use_only;
    if ((ulong)((long)pcVar9 - (long)pcVar8) < 0x80) {
      _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(a,0x80);
      pcVar8 = a->ptr_dont_copy_me__upb_internal_use_only;
      pcVar9 = a->end_dont_copy_me__upb_internal_use_only;
    }
    else {
      if ((char *)((ulong)(pcVar8 + 7) & 0xfffffffffffffff8) != pcVar8) {
LAB_00178378:
        __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                      ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
      }
      pcVar8 = pcVar8 + 0x80;
      a->ptr_dont_copy_me__upb_internal_use_only = pcVar8;
    }
    if ((ulong)((long)pcVar9 - (long)pcVar8) < 0x80) {
      _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(a,0x80);
    }
    else {
      if ((char *)((ulong)(pcVar8 + 7) & 0xfffffffffffffff8) != pcVar8) goto LAB_00178378;
      a->ptr_dont_copy_me__upb_internal_use_only = pcVar8 + 0x80;
    }
    lVar10 = lVar10 + 0x58;
    upb_Arena_Free(a);
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

TEST(ArenaTest, FuzzFuseFreeAllocatorRace) {
  upb_Arena_SetMaxBlockSize(128);
  upb_alloc_func* old = upb_alloc_global.func;
  upb_alloc_global.func = checking_global_allocfunc;
  absl::Cleanup reset_max_block_size = [old] {
    upb_Arena_SetMaxBlockSize(UPB_PRIVATE(kUpbDefaultMaxBlockSize));
    upb_alloc_global.func = old;
  };
  absl::Notification done;
  std::vector<std::thread> threads;
  size_t thread_count = 10;
  std::vector<std::array<upb_Arena*, 11>> arenas;
  for (size_t i = 0; i < 10000; ++i) {
    std::array<upb_Arena*, 11> arr;
    arr[0] = upb_Arena_New();
    for (size_t j = 1; j < thread_count + 1; ++j) {
      arr[j] = upb_Arena_New();
      upb_Arena_Fuse(arr[j - 1], arr[j]);
    }
    arenas.push_back(arr);
  }
  for (size_t i = 0; i < thread_count; ++i) {
    size_t tid = i;
    threads.emplace_back([&, tid]() {
      size_t arenaCtr = 0;
      while (!done.HasBeenNotified() && arenaCtr < arenas.size()) {
        upb_Arena* read = arenas[arenaCtr++][tid];
        (void)upb_Arena_Malloc(read, 128);
        (void)upb_Arena_Malloc(read, 128);
        upb_Arena_Free(read);
      }
      while (arenaCtr < arenas.size()) {
        upb_Arena_Free(arenas[arenaCtr++][tid]);
      }
    });
  }
  auto end = absl::Now() + absl::Seconds(2);
  size_t arenaCtr = 0;
  while (absl::Now() < end && arenaCtr < arenas.size()) {
    upb_Arena* read = arenas[arenaCtr++][thread_count];
    (void)upb_Arena_Malloc(read, 128);
    (void)upb_Arena_Malloc(read, 128);
    upb_Arena_Free(read);
  }
  done.Notify();
  while (arenaCtr < arenas.size()) {
    upb_Arena_Free(arenas[arenaCtr++][thread_count]);
  }
  for (auto& t : threads) t.join();
}